

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# w3interp.cpp
# Opt level: O0

void __thiscall w3Interp::i64_Load32s(w3Interp *this)

{
  int *piVar1;
  w3Interp *this_local;
  
  piVar1 = (int *)LoadStore(this,4);
  w3Stack::push_i64(&this->super_w3Stack,(long)*piVar1);
  return;
}

Assistant:

INTERP (i64_Load32s)
{
    push_i64 (*(int32_t*)LoadStore (4));
}